

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O2

void sorter_heap_sort(int64_t *dst,size_t size)

{
  int64_t iVar1;
  size_t sVar2;
  bool bVar3;
  
  if (1 < size) {
    sVar2 = size >> 1;
    do {
      sorter_heap_sift_down(dst,sVar2,size - 1);
      bVar3 = sVar2 != 0;
      sVar2 = sVar2 - 1;
    } while (bVar3);
    for (sVar2 = size - 2; sVar2 != 0xffffffffffffffff; sVar2 = sVar2 - 1) {
      iVar1 = dst[sVar2 + 1];
      dst[sVar2 + 1] = *dst;
      *dst = iVar1;
      sorter_heap_sift_down(dst,0,sVar2);
    }
  }
  return;
}

Assistant:

void HEAP_SORT(SORT_TYPE *dst, const size_t size) {
  size_t end = size - 1;

  /* don't bother sorting an array of size <= 1 */
  if (size <= 1) {
    return;
  }

  HEAPIFY(dst, size);

  while (end > 0) {
    SORT_SWAP(dst[end], dst[0]);
    HEAP_SIFT_DOWN(dst, 0, end - 1);
    end--;
  }
}